

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O2

bool __thiscall
ON_BinaryArchive::WriteModelComponentAttributes
          (ON_BinaryArchive *this,ON_ModelComponent *model_component,uint attributes_filter)

{
  ON__UINT32 i;
  ON__UINT32 i_00;
  bool bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ON_UUID component_id;
  
  bVar1 = BeginWrite3dmChunk(this,0x40008002,1,0);
  if (!bVar1) {
    return false;
  }
  bVar2 = (byte)(attributes_filter >> 2) & 1;
  bVar4 = bVar2;
  if ((model_component->m_set_status & 4) == 0) {
    bVar4 = 2;
  }
  bVar4 = bVar4 & -bVar2;
  bVar1 = WriteChar(this,bVar4);
  if (bVar1) {
    if (bVar4 == 1) {
      i = model_component->m_reference_model_serial_number;
      i_00 = model_component->m_linked_idef_serial_number;
      bVar1 = WriteInt(this,model_component->m_model_serial_number);
      if (((!bVar1) || (bVar1 = WriteInt(this,i), !bVar1)) || (bVar1 = WriteInt(this,i_00), !bVar1))
      goto LAB_00547275;
    }
    bVar4 = (byte)attributes_filter;
    bVar2 = bVar4 >> 3 & 1;
    bVar3 = -bVar2;
    if ((model_component->m_set_status & 8) == 0) {
      bVar2 = 2;
    }
    bVar1 = WriteChar(this,bVar2 & bVar3);
    if (bVar1) {
      if ((bVar2 & bVar3) == 1) {
        component_id.Data1 = (model_component->m_component_id).Data1;
        component_id.Data2 = (model_component->m_component_id).Data2;
        component_id.Data3 = (model_component->m_component_id).Data3;
        component_id.Data4 = *&(model_component->m_component_id).Data4;
        bVar1 = WriteUuid(this,&component_id);
        if (!bVar1) goto LAB_00547275;
      }
      bVar2 = (byte)(attributes_filter >> 1) & 1;
      bVar3 = -bVar2;
      if ((model_component->m_set_status & 2) == 0) {
        bVar2 = 2;
      }
      bVar1 = WriteChar(this,bVar2 & bVar3);
      if ((bVar1) &&
         (((bVar2 & bVar3) != 1 ||
          (bVar1 = WriteInt(this,(uint)model_component->m_component_type), bVar1)))) {
        bVar2 = bVar4 >> 4 & 1;
        bVar3 = -bVar2;
        if ((model_component->m_set_status & 0x10) == 0) {
          bVar2 = 2;
        }
        bVar1 = WriteChar(this,bVar2 & bVar3);
        if ((bVar1) &&
           (((bVar2 & bVar3) != 1 ||
            (bVar1 = Write3dmReferencedComponentIndex(this,model_component), bVar1)))) {
          bVar4 = bVar4 >> 5 & 1;
          bVar2 = -bVar4;
          if ((model_component->m_set_status & 0x20) == 0) {
            bVar4 = 2;
          }
          bVar1 = WriteChar(this,bVar4 & bVar2);
          if ((bVar1) &&
             (((bVar4 & bVar2) != 1 ||
              (bVar1 = WriteModelComponentName(this,model_component), bVar1)))) {
            bVar4 = 1;
            goto LAB_00547277;
          }
        }
      }
    }
  }
LAB_00547275:
  bVar4 = 0;
LAB_00547277:
  bVar1 = EndWrite3dmChunk(this);
  return (bool)(bVar1 & bVar4);
}

Assistant:

bool ON_BinaryArchive::WriteModelComponentAttributes(
  const class ON_ModelComponent& model_component,
  unsigned int attributes_filter
  )
{
  if (false == BeginWrite3dmChunk(TCODE_MODEL_ATTRIBUTES_CHUNK,1,0))
    return false;

  bool rc = false;
  for (;;)
  {
    unsigned int bit = ON_ModelComponent::Attributes::ModelSerialNumberAttribute & attributes_filter;
    unsigned char write_status = (0 != bit) ? 1 : 0;
    if ( 0 != write_status && false == model_component.ModelSerialNumberIsSet() )
      write_status = 2;
    if (!WriteChar(write_status))
      break;
    if (1 == write_status )
    {
      const unsigned int model_serial_number = model_component.ModelSerialNumber();
      const unsigned int reference_model_serial_number = model_component.ReferenceModelSerialNumber();
      const unsigned int instance_definition_model_serial_number = model_component.InstanceDefinitionModelSerialNumber();
      if ( !WriteInt(model_serial_number) )
        break;
      if ( !WriteInt(reference_model_serial_number) )
        break;
      if ( !WriteInt(instance_definition_model_serial_number) )
        break;
    }

    bit = ON_ModelComponent::Attributes::IdAttribute & attributes_filter;
    write_status = (0 != bit) ? 1 : 0;
    if ( 0 != write_status && false == model_component.IdIsSet() )
      write_status = 2;
    if (!WriteChar(write_status))
      break;
    if (1 == write_status )
    {
      ON_UUID component_id = model_component.Id();
      if ( !WriteUuid(component_id) )
        break;
    }

    bit = ON_ModelComponent::Attributes::TypeAttribute & attributes_filter;
    write_status = (0 != bit) ? 1 : 0;
    if ( 0 != write_status && false == model_component.ComponentTypeIsSet() )
      write_status = 2;
    if (!WriteChar(write_status))
      break;
    if (1 == write_status )
    {
      unsigned int component_type_as_unsigned = static_cast<unsigned int>(model_component.ComponentType());
      if ( !WriteInt(component_type_as_unsigned) )
        break;
    }

    bit = ON_ModelComponent::Attributes::IndexAttribute & attributes_filter;
    write_status = (0 != bit) ? 1 : 0;
    if ( 0 != write_status && false == model_component.IndexIsSet() )
      write_status = 2;
    if (!WriteChar(write_status))
      break;
    if (1 == write_status )
    {
      if ( !Write3dmReferencedComponentIndex( model_component ) )
        break;
    }

    bit = ON_ModelComponent::Attributes::NameAttribute & attributes_filter;
    write_status = (0 != bit) ? 1 : 0;
    if ( 0 != write_status && false == model_component.NameIsSet() )
      write_status = 2;
    if (!WriteChar(write_status))
      break;
    if (1 == write_status )
    {
      if (false == this->WriteModelComponentName(model_component) )
        break;
    }

    rc = true;
    break;
  }

  if (false == EndWrite3dmChunk())
    rc = false;

  return rc;
}